

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

TableSize * __thiscall MixedArena::alloc<wasm::TableSize>(MixedArena *this)

{
  TableSize *this_00;
  TableSize *ret;
  MixedArena *this_local;
  
  this_00 = (TableSize *)allocSpace(this,0x20,8);
  ::wasm::TableSize::TableSize(this_00,this);
  return this_00;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }